

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O0

STRING_HANDLE URL_Encode(STRING_HANDLE input)

{
  LOGGER_LOG p_Var1;
  char *text;
  LOGGER_LOG l;
  STRING_HANDLE result;
  STRING_HANDLE input_local;
  
  if (input == (STRING_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/urlencode.c"
                ,"URL_Encode",0x11d,1,"URL_Encode:: NULL input");
    }
  }
  else {
    text = STRING_c_str(input);
    l = (LOGGER_LOG)encode_url_data(text);
  }
  return (STRING_HANDLE)l;
}

Assistant:

STRING_HANDLE URL_Encode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        /*Codes_SRS_URL_ENCODE_06_001: [If input is NULL then URL_Encode will return NULL.]*/
        result = NULL;
        LogError("URL_Encode:: NULL input");
    }
    else
    {
        result = encode_url_data(STRING_c_str(input));
    }
    return result;
}